

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_common.hpp
# Opt level: O0

void __thiscall
spirv_cross::SPIRConstantOp::SPIRConstantOp
          (SPIRConstantOp *this,TypeID result_type,Op op,uint32_t *args,uint32_t length)

{
  uint local_30;
  uint32_t i;
  uint32_t length_local;
  uint32_t *args_local;
  Op op_local;
  SPIRConstantOp *this_local;
  TypeID result_type_local;
  
  IVariant::IVariant(&this->super_IVariant);
  (this->super_IVariant)._vptr_IVariant = (_func_int **)&PTR__SPIRConstantOp_008576b0;
  *(Op *)&(this->super_IVariant).field_0xc = op;
  SmallVector<unsigned_int,_8UL>::SmallVector(&this->arguments);
  (this->basetype).id = result_type.id;
  SmallVector<unsigned_int,_8UL>::reserve(&this->arguments,(ulong)length);
  for (local_30 = 0; local_30 < length; local_30 = local_30 + 1) {
    SmallVector<unsigned_int,_8UL>::push_back(&this->arguments,args + local_30);
  }
  return;
}

Assistant:

SPIRConstantOp(TypeID result_type, spv::Op op, const uint32_t *args, uint32_t length)
	    : opcode(op)
	    , basetype(result_type)
	{
		arguments.reserve(length);
		for (uint32_t i = 0; i < length; i++)
			arguments.push_back(args[i]);
	}